

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_read_image.cxx
# Opt level: O0

Fl_RGB_Image *
traverse_to_gl_subwindows
          (Fl_Group *g,uchar *p,int x,int y,int w,int h,int alpha,Fl_RGB_Image *full_img)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  Fl_Plugin *pFVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Fl_Window *pFVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  uchar *bits;
  Fl_Widget *this;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  Fl_RGB_Image *pFVar8;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  bool bVar9;
  uchar *local_150;
  bool local_141;
  uchar *local_e8;
  int local_c4;
  int top;
  Fl_RGB_Image *img_1;
  int height;
  int width;
  int origin_y;
  int origin_x;
  Fl_Widget *c;
  int i;
  int n;
  int alloc_img;
  uchar *image_data;
  uchar *data;
  Fl_RGB_Image *img;
  Fl_Device_Plugin *pi;
  Fl_Plugin_Manager pm;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  uchar *p_local;
  Fl_Group *g_local;
  
  pm.super_Fl_Preferences.rootNode._0_4_ = h;
  pm.super_Fl_Preferences.rootNode._4_4_ = w;
  iVar1 = (*(g->super_Fl_Widget)._vptr_Fl_Widget[9])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    iVar1 = (*(g->super_Fl_Widget)._vptr_Fl_Widget[8])();
    if (CONCAT44(extraout_var_01,iVar1) != 0) {
      if (full_img != (Fl_RGB_Image *)0x0) {
        pFVar7 = Fl_Widget::window(&g->super_Fl_Widget);
        if (pFVar7 == (Fl_Window *)0x0) goto LAB_002534e6;
        pFVar7 = Fl_Widget::window(&g->super_Fl_Widget);
        iVar1 = (*(pFVar7->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[9])();
        if (CONCAT44(extraout_var_02,iVar1) == 0) goto LAB_002534e6;
      }
      if (full_img != (Fl_RGB_Image *)0x0) {
        iVar1 = (*(g->super_Fl_Widget)._vptr_Fl_Widget[8])();
        Fl_Window::make_current((Fl_Window *)CONCAT44(extraout_var_03,iVar1));
      }
      local_141 = full_img != (Fl_RGB_Image *)0x0 || p == (uchar *)0x0;
      local_150 = p;
      if (full_img != (Fl_RGB_Image *)0x0 || p == (uchar *)0x0) {
        local_150 = (uchar *)0x0;
      }
      bits = read_win_rectangle(local_150,x,y,pm.super_Fl_Preferences.rootNode._4_4_,
                                (int)pm.super_Fl_Preferences.rootNode,alpha);
      full_img = (Fl_RGB_Image *)operator_new(0x40);
      Fl_RGB_Image::Fl_RGB_Image
                (full_img,bits,pm.super_Fl_Preferences.rootNode._4_4_,
                 (int)pm.super_Fl_Preferences.rootNode,4 - (uint)(alpha == 0),0);
      if (local_141) {
        full_img->alloc_array = 1;
      }
    }
  }
  else {
    Fl_Plugin_Manager::Fl_Plugin_Manager((Fl_Plugin_Manager *)&pi,"fltk:device");
    pFVar6 = Fl_Plugin_Manager::plugin((Fl_Plugin_Manager *)&pi,"opengl.device.fltk.org");
    if (pFVar6 == (Fl_Plugin *)0x0) {
      g_local = (Fl_Group *)full_img;
      bVar9 = true;
    }
    else {
      iVar1 = (*pFVar6->_vptr_Fl_Plugin[5])
                        (pFVar6,g,(ulong)(uint)x,(ulong)(uint)y,
                         (ulong)pm.super_Fl_Preferences.rootNode._4_4_);
      pFVar8 = (Fl_RGB_Image *)CONCAT44(extraout_var_00,iVar1);
      bVar9 = full_img == (Fl_RGB_Image *)0x0;
      full_img = pFVar8;
      if (bVar9) {
        local_e8 = p;
        if (p == (uchar *)0x0) {
          iVar1 = Fl_Image::w((Fl_Image *)pFVar8);
          iVar3 = Fl_Image::h((Fl_Image *)pFVar8);
          local_e8 = (uchar *)operator_new__((long)(int)(iVar1 * iVar3 * (4 - (uint)(alpha == 0))));
        }
        full_img = (Fl_RGB_Image *)operator_new(0x40);
        iVar1 = Fl_Image::w((Fl_Image *)pFVar8);
        iVar3 = Fl_Image::h((Fl_Image *)pFVar8);
        Fl_RGB_Image::Fl_RGB_Image(full_img,local_e8,iVar1,iVar3,4 - (uint)(alpha == 0),0);
        if (p == (uchar *)0x0) {
          full_img->alloc_array = 1;
        }
        if (alpha != 0) {
          iVar1 = Fl_Image::w((Fl_Image *)pFVar8);
          iVar3 = Fl_Image::h((Fl_Image *)pFVar8);
          memset(local_e8,alpha & 0xff,(long)(iVar1 * iVar3 * 4));
        }
        write_image_inside(full_img,pFVar8,0,0);
        if (pFVar8 != (Fl_RGB_Image *)0x0) {
          (*(pFVar8->super_Fl_Image)._vptr_Fl_Image[1])();
        }
      }
      bVar9 = false;
    }
    Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&pi);
    if (bVar9) {
      return (Fl_RGB_Image *)g_local;
    }
  }
LAB_002534e6:
  iVar1 = Fl_Group::children(g);
  for (c._4_4_ = 0; c._4_4_ < iVar1; c._4_4_ = c._4_4_ + 1) {
    this = Fl_Group::child(g,c._4_4_);
    uVar2 = Fl_Widget::visible(this);
    if ((uVar2 != 0) &&
       (iVar3 = (*this->_vptr_Fl_Widget[7])(), CONCAT44(extraout_var_04,iVar3) != 0)) {
      iVar3 = (*this->_vptr_Fl_Widget[8])();
      if (CONCAT44(extraout_var_05,iVar3) == 0) {
        iVar3 = (*this->_vptr_Fl_Widget[7])();
        traverse_to_gl_subwindows
                  ((Fl_Group *)CONCAT44(extraout_var_08,iVar3),p,x,y,
                   pm.super_Fl_Preferences.rootNode._4_4_,(int)pm.super_Fl_Preferences.rootNode,
                   alpha,full_img);
      }
      else {
        iVar3 = Fl_Widget::x(this);
        width = x;
        if (x < iVar3) {
          width = Fl_Widget::x(this);
        }
        iVar3 = Fl_Widget::y(this);
        height = y;
        if (y < iVar3) {
          height = Fl_Widget::y(this);
        }
        img_1._4_4_ = Fl_Widget::w(this);
        iVar3 = Fl_Widget::x(this);
        iVar4 = Fl_Widget::w(this);
        if (iVar3 + iVar4 < width + img_1._4_4_) {
          iVar3 = Fl_Widget::x(this);
          iVar4 = Fl_Widget::w(this);
          img_1._4_4_ = (iVar3 + iVar4) - width;
        }
        if ((int)(x + pm.super_Fl_Preferences.rootNode._4_4_) < width + img_1._4_4_) {
          img_1._4_4_ = (x + pm.super_Fl_Preferences.rootNode._4_4_) - width;
        }
        img_1._0_4_ = Fl_Widget::w(this);
        iVar3 = Fl_Widget::y(this);
        iVar4 = Fl_Widget::h(this);
        if (iVar3 + iVar4 < height + (int)img_1) {
          iVar3 = Fl_Widget::y(this);
          iVar4 = Fl_Widget::h(this);
          img_1._0_4_ = (iVar3 + iVar4) - height;
        }
        if (y + (int)pm.super_Fl_Preferences.rootNode < height + (int)img_1) {
          img_1._0_4_ = (y + (int)pm.super_Fl_Preferences.rootNode) - height;
        }
        if ((0 < img_1._4_4_) && (0 < (int)img_1)) {
          iVar3 = (*this->_vptr_Fl_Widget[8])();
          iVar4 = Fl_Widget::x(this);
          iVar5 = Fl_Widget::y(this);
          pFVar8 = traverse_to_gl_subwindows
                             ((Fl_Group *)CONCAT44(extraout_var_06,iVar3),p,width - iVar4,
                              height - iVar5,img_1._4_4_,(int)img_1,alpha,full_img);
          if (pFVar8 != full_img) {
            iVar3 = (*this->_vptr_Fl_Widget[9])();
            if (CONCAT44(extraout_var_07,iVar3) == 0) {
              local_c4 = Fl_Image::h(&full_img->super_Fl_Image);
              iVar3 = Fl_Image::h(&pFVar8->super_Fl_Image);
              local_c4 = local_c4 - ((height - y) + iVar3);
            }
            else {
              local_c4 = height - y;
            }
            write_image_inside(full_img,pFVar8,width - x,local_c4);
            if (pFVar8 != (Fl_RGB_Image *)0x0) {
              (*(pFVar8->super_Fl_Image)._vptr_Fl_Image[1])();
            }
          }
        }
      }
    }
  }
  return full_img;
}

Assistant:

static Fl_RGB_Image *traverse_to_gl_subwindows(Fl_Group *g, uchar *p, int x, int y, int w, int h, int alpha,
                                               Fl_RGB_Image *full_img)
{
  if ( g->as_gl_window() ) {
    Fl_Plugin_Manager pm("fltk:device");
    Fl_Device_Plugin *pi = (Fl_Device_Plugin*)pm.plugin("opengl.device.fltk.org");
    if (!pi) return full_img;
    Fl_RGB_Image *img = pi->rectangle_capture(g, x, y, w, h); // bottom to top image
    if (full_img) full_img = img; // top and bottom will be exchanged later
    else { // exchange top and bottom to get a proper FLTK image
      uchar *data = ( p ? p : new uchar[img->w() * img->h() * (alpha?4:3)] );
      full_img = new Fl_RGB_Image(data, img->w(), img->h(), alpha?4:3);
      if (!p) full_img->alloc_array = 1;
      if (alpha) memset(data, alpha, img->w() * img->h() * 4);
      write_image_inside(full_img, img, 0, 0);
      delete img;
    }
  }
  else if ( g->as_window() && (!full_img || (g->window() && g->window()->as_gl_window())) ) {
    // the starting window or one inside a GL window
    if (full_img) g->as_window()->make_current();
    uchar *image_data;
    int alloc_img = (full_img != NULL || p == NULL); // false means use p, don't alloc new memory for image
#ifdef __APPLE_CC__
    // on Darwin + X11, read_win_rectangle() sometimes returns NULL when there are subwindows
    do image_data = read_win_rectangle( (alloc_img ? NULL : p), x, y, w, h, alpha); while (!image_data);
#else
    image_data = read_win_rectangle( (alloc_img ? NULL : p), x, y, w, h, alpha);
#endif
    full_img = new Fl_RGB_Image(image_data, w, h, alpha?4:3);
    if (alloc_img) full_img->alloc_array = 1;
  }
  int n = g->children();
  for (int i = 0; i < n; i++) {
    Fl_Widget *c = g->child(i);
    if ( !c->visible() || !c->as_group()) continue;
    if ( c->as_window() ) {
      int origin_x = x; // compute intersection of x,y,w,h and the c window
      if (x < c->x()) origin_x = c->x();
      int origin_y = y;
      if (y < c->y()) origin_y = c->y();
      int width = c->w();
      if (origin_x + width > c->x() + c->w()) width = c->x() + c->w() - origin_x;
      if (origin_x + width > x + w) width = x + w - origin_x;
      int height = c->w();
      if (origin_y + height > c->y() + c->h()) height = c->y() + c->h() - origin_y;
      if (origin_y + height > y + h) height = y + h - origin_y;
      if (width > 0 && height > 0) {
        Fl_RGB_Image *img = traverse_to_gl_subwindows(c->as_window(), p, origin_x - c->x(),
                                                      origin_y - c->y(), width, height, alpha, full_img);
        if (img == full_img) continue;
        int top;
        if (c->as_gl_window()) {
          top = origin_y - y;
        } else {
          top = full_img->h() - (origin_y - y + img->h());
        }
        write_image_inside(full_img, img, origin_x - x, top);
        delete img;
      }
    }
    else traverse_to_gl_subwindows(c->as_group(), p, x, y, w, h, alpha, full_img);
  }
  return full_img;
}